

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_pointerLikeType_load(sysbvm_context_t *context,sysbvm_tuple_t pointerLikeValue)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_pointerLikeType_t *pointerLikeType;
  intptr_t offset;
  sysbvm_tuple_t base;
  sysbvm_tuple_t storage;
  sysbvm_object_tuple_t *pointerObject;
  size_t slotCount;
  sysbvm_tuple_t valueType;
  sysbvm_tuple_t pointerLikeValue_local;
  sysbvm_context_t *context_local;
  
  if (pointerLikeValue == 0) {
    sysbvm_error("Accessing null pointer.");
  }
  sVar2 = sysbvm_tuple_getType(context,pointerLikeValue);
  _Var1 = sysbvm_type_isPointerLikeType(sVar2);
  if (!_Var1) {
    _Var1 = sysbvm_tuple_isKindOf(context,sVar2,(context->roots).valueType);
    if (_Var1) {
      return pointerLikeValue;
    }
    sysbvm_error("Expected a pointer like value.");
  }
  sVar3 = sysbvm_tuple_getSizeInSlots(pointerLikeValue);
  if (sVar3 == 0) {
    sysbvm_error("Expected a pointer like value with at least single slot.");
  }
  sVar2 = *(sysbvm_tuple_t *)(pointerLikeValue + 0x10);
  offset = 0;
  pointerLikeType = (sysbvm_pointerLikeType_t *)sysbvm_tuple_intptr_encode(context,0);
  if ((1 < sVar3) && (offset = *(intptr_t *)(pointerLikeValue + 0x18), 2 < sVar3)) {
    pointerLikeType = *(sysbvm_pointerLikeType_t **)(pointerLikeValue + 0x20);
  }
  sVar4 = sysbvm_tuple_getType(context,sVar2);
  if (sVar4 == (context->roots).valueBoxType) {
    context_local = *(sysbvm_context_t **)(sVar2 + 0x10);
  }
  else {
    sVar4 = sysbvm_tuple_getType(context,pointerLikeValue);
    context_local =
         (sysbvm_context_t *)
         sysbvm_tuple_send3(context,(context->roots).loadFromAtOffsetWithTypeSelector,sVar2,offset,
                            (sysbvm_tuple_t)pointerLikeType,*(sysbvm_tuple_t *)(sVar4 + 0xf8));
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_pointerLikeType_load(sysbvm_context_t *context, sysbvm_tuple_t pointerLikeValue)
{
    if(!pointerLikeValue)
        sysbvm_error("Accessing null pointer.");
    sysbvm_tuple_t valueType = sysbvm_tuple_getType(context, pointerLikeValue);
    if(!sysbvm_type_isPointerLikeType(valueType))
    {
        // HACK: Allow treating the value types as pointers to themselves.
        if(sysbvm_tuple_isKindOf(context, valueType, context->roots.valueType))
            return pointerLikeValue;

        sysbvm_error("Expected a pointer like value.");
    }

    size_t slotCount = sysbvm_tuple_getSizeInSlots(pointerLikeValue);
    if(slotCount == 0)
        sysbvm_error("Expected a pointer like value with at least single slot.");

    sysbvm_object_tuple_t *pointerObject = (sysbvm_object_tuple_t*)pointerLikeValue;
    sysbvm_tuple_t storage = pointerObject->pointers[0];
    sysbvm_tuple_t base = SYSBVM_NULL_TUPLE;
    intptr_t offset = sysbvm_tuple_intptr_encode(context, 0);
    if(slotCount >= 2)
    {
        base = pointerObject->pointers[1];
        if(slotCount >= 3)
            offset = pointerObject->pointers[2];
    }

    if(sysbvm_tuple_getType(context, storage) == context->roots.valueBoxType)
        return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(storage)->pointers[0];

    sysbvm_pointerLikeType_t *pointerLikeType = (sysbvm_pointerLikeType_t*)sysbvm_tuple_getType(context, pointerLikeValue);
    return sysbvm_tuple_send3(context, context->roots.loadFromAtOffsetWithTypeSelector, storage, base, offset, pointerLikeType->baseType);
}